

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_writer.cc
# Opt level: O3

Status * google::protobuf::util::converter::anon_unknown_8::WriteFloat
                   (Status *__return_storage_ptr__,int field_number,DataPiece *data,
                   CodedOutputStream *stream)

{
  Status *extraout_RAX;
  Status *pSVar1;
  undefined1 local_58 [8];
  StatusOr<float> f;
  
  DataPiece::ToFloat((StatusOr<float> *)local_58,data);
  if (local_58._0_4_ == OK) {
    protobuf::internal::WireFormatLite::WriteFloat
              (field_number,(float)f.status_.error_message_.field_2._8_4_,stream);
  }
  Status::Status(__return_storage_ptr__,(Status *)local_58);
  pSVar1 = (Status *)&f.status_.error_message_._M_string_length;
  if ((Status *)f.status_._0_8_ != pSVar1) {
    operator_delete((void *)f.status_._0_8_);
    pSVar1 = extraout_RAX;
  }
  return pSVar1;
}

Assistant:

inline Status WriteFloat(int field_number, const DataPiece& data,
                         CodedOutputStream* stream) {
  StatusOr<float> f = data.ToFloat();
  if (f.ok()) {
    WireFormatLite::WriteFloat(field_number, f.value(), stream);
  }
  return f.status();
}